

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void InitClass(nodecontext *p,nodeclass *Class)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  nodeclass *pnVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  short sVar11;
  int iVar12;
  nodemeta *pnVar13;
  nodemetalookuphead *pnVar14;
  long lVar15;
  node *pnVar16;
  ulong __n;
  byte bVar17;
  nodemeta *pnVar18;
  size_t __n_00;
  nodecontext *pnVar19;
  char *pcVar20;
  uintptr_t Data;
  array local_58;
  nodecontext *local_40;
  undefined4 local_38 [2];
  
  if (Class->State != '\0') {
    return;
  }
  if (Class->Meta == (nodemeta *)0x0) {
    return;
  }
  pnVar4 = Class->ParentClass;
  if (Class->ParentId != 0) {
    if (pnVar4 == (nodeclass *)0x0) {
      return;
    }
    if (pnVar4->State < '\x01') {
      return;
    }
  }
  if (pnVar4 != (nodeclass *)0x0) {
    if (((Class->VMTSize == 0x48) && (0x48 < pnVar4->VMTSize)) &&
       (Class = NodeClassResize(p,Class,pnVar4->VMTSize), Class == (nodeclass *)0x0)) {
      Class = (nodeclass *)0x0;
      bVar6 = false;
    }
    else {
      __n = pnVar4->VMTSize;
      if (__n < 0x48) {
        __assert_fail("Parent->VMTSize >= DEFAULT_VMT",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x485,"void InitClass(nodecontext *, nodeclass *)");
      }
      uVar5 = Class->VMTSize;
      if (uVar5 < __n) {
        __assert_fail("Class->VMTSize >= Parent->VMTSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x486,"void InitClass(nodecontext *, nodeclass *)");
      }
      if (*(long *)(pnVar4 + 1) != *(long *)(Class + 1)) {
        __assert_fail("NodeClass_Context(Parent) == NodeClass_Context(Class)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x487,"void InitClass(nodecontext *, nodeclass *)");
      }
      uVar2 = *(undefined4 *)&Class[1].Meta;
      if (uVar5 < __n) {
        __n = uVar5;
      }
      memcpy(Class + 1,pnVar4 + 1,__n);
      *(undefined4 *)&Class[1].Meta = uVar2;
      bVar6 = true;
    }
    if (!bVar6) {
      return;
    }
  }
  bVar1 = *(byte *)Class->Meta;
  if (bVar1 == 0) {
    bVar6 = true;
    bVar7 = true;
    bVar9 = true;
  }
  else {
    bVar6 = false;
    pnVar18 = Class->Meta;
    bVar8 = false;
    bVar10 = false;
    do {
      pnVar13 = pnVar18 + 1;
      bVar17 = bVar1 & 0xc0;
      if (bVar17 == 0x40) {
        bVar6 = true;
      }
      if (bVar1 == 0x28) {
        bVar6 = true;
      }
      bVar7 = true;
      if ((((bVar1 | 4) != 0x2d) && (bVar7 = bVar8, bVar17 == 0x40)) &&
         ((bVar7 = true, *(byte *)pnVar13 == 2 && (bVar7 = bVar8, (pnVar18[1].Data & 1) == 0)))) {
        bVar7 = true;
      }
      bVar8 = true;
      bVar9 = bVar8;
      if (((bVar1 != 0x2a) && (bVar1 != 0x2d)) &&
         ((bVar9 = bVar10, bVar17 == 0x40 &&
          ((bVar9 = bVar8, *(byte *)pnVar13 == 2 && (bVar9 = bVar10, (pnVar18[1].Data & 1) == 0)))))
         ) {
        bVar9 = true;
      }
      bVar1 = *(byte *)pnVar13;
      pnVar18 = pnVar13;
      bVar8 = bVar7;
      bVar10 = bVar9;
    } while (bVar1 != 0);
    bVar6 = !bVar6;
    bVar7 = !bVar7;
    bVar9 = !bVar9;
  }
  local_40 = p;
  if (bVar6) {
    if (Class->ParentClass != (nodeclass *)0x0) {
      pnVar14 = Class->ParentClass->MetaGet;
LAB_001034b7:
      Class->MetaGet = pnVar14;
    }
  }
  else {
    local_58._Begin = (char *)0x0;
    local_58._Used = 0;
    for (pnVar4 = Class; pnVar4 != (nodeclass *)0x0; pnVar4 = pnVar4->ParentClass) {
      pnVar18 = pnVar4->Meta;
      if (pnVar18 != (nodemeta *)0x0) {
        bVar1 = *(byte *)pnVar18;
        while (bVar1 != 0) {
          if ((bVar1 == 0x28) || ((bVar1 & 0xc0) == 0x40)) {
            AddLookup(Class,pnVar18,&local_58);
          }
          pnVar13 = pnVar18 + 1;
          pnVar18 = pnVar18 + 1;
          bVar1 = *(byte *)pnVar13;
        }
      }
    }
    if (local_58._Used != 0) {
      pnVar14 = BuildLookup(local_40,&local_58);
      goto LAB_001034b7;
    }
  }
  pnVar19 = local_40;
  if (bVar7) {
    if (Class->ParentClass != (nodeclass *)0x0) {
      pnVar14 = Class->ParentClass->MetaSet;
LAB_00103560:
      Class->MetaSet = pnVar14;
    }
  }
  else {
    local_58._Begin = (char *)0x0;
    local_58._Used = 0;
    for (pnVar4 = Class; local_40 = pnVar19, pnVar4 != (nodeclass *)0x0;
        pnVar4 = pnVar4->ParentClass) {
      pnVar18 = pnVar4->Meta;
      if (pnVar18 != (nodemeta *)0x0) {
        bVar1 = *(byte *)pnVar18;
        while (bVar1 != 0) {
          if (((bVar1 | 4) == 0x2d) ||
             (((bVar1 & 0xc0) == 0x40 &&
              ((*(char *)(pnVar18 + 1) != '\x02' || ((pnVar18[1].Data & 1) == 0)))))) {
            AddLookup(Class,pnVar18,&local_58);
          }
          pnVar13 = pnVar18 + 1;
          pnVar18 = pnVar18 + 1;
          bVar1 = *(byte *)pnVar13;
        }
      }
      pnVar19 = local_40;
    }
    if (local_58._Used != 0) {
      pnVar14 = BuildLookup(pnVar19,&local_58);
      goto LAB_00103560;
    }
  }
  if (bVar9) {
    if (Class->ParentClass == (nodeclass *)0x0) goto LAB_0010360a;
    pnVar14 = Class->ParentClass->MetaUnSet;
  }
  else {
    local_58._Begin = (char *)0x0;
    local_58._Used = 0;
    pnVar19 = local_40;
    for (pnVar4 = Class; local_40 = pnVar19, pnVar4 != (nodeclass *)0x0;
        pnVar4 = pnVar4->ParentClass) {
      pnVar18 = pnVar4->Meta;
      if (pnVar18 != (nodemeta *)0x0) {
        bVar1 = *(byte *)pnVar18;
        while (bVar1 != 0) {
          if (((bVar1 == 0x2a) || (bVar1 == 0x2d)) ||
             (((bVar1 & 0xc0) == 0x40 &&
              ((*(char *)(pnVar18 + 1) != '\x02' || ((pnVar18[1].Data & 1) == 0)))))) {
            AddLookup(Class,pnVar18,&local_58);
          }
          pnVar13 = pnVar18 + 1;
          pnVar18 = pnVar18 + 1;
          bVar1 = *(byte *)pnVar13;
        }
      }
      pnVar19 = local_40;
    }
    if (local_58._Used == 0) goto LAB_0010360a;
    pnVar14 = BuildLookup(pnVar19,&local_58);
  }
  Class->MetaUnSet = pnVar14;
LAB_0010360a:
  if (Class->VMTSize < 0x48) {
    __assert_fail("Class->VMTSize >= DEFAULT_VMT",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x490,"void InitClass(nodecontext *, nodeclass *)");
  }
  Class->State = '\x01';
  uVar3 = *(uint *)Class->Meta;
  if ((char)uVar3 != '\0') {
    pnVar4 = Class + 1;
    pnVar18 = Class->Meta;
    do {
      if ((~uVar3 & 0xc0) == 0) {
        if ((0x20421e08642U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          __n_00 = (size_t)ParamSize[uVar3 & 0x3f];
          memset((void *)((long)&pnVar4->FourCC + (ulong)(uVar3 >> 8)),0,__n_00);
          pnVar19 = local_40;
          if (7 < __n_00) {
            __n_00 = 8;
          }
          memcpy((void *)((long)&pnVar4->FourCC + (ulong)(*(uint *)pnVar18 >> 8)),&pnVar18->Data,
                 __n_00);
        }
        else {
          *(uintptr_t *)((long)&pnVar4->FourCC + (ulong)(uVar3 >> 8)) = pnVar18->Data;
        }
      }
      else {
        switch(uVar3 & 0xff) {
        case 0xb:
          Class->Flags = (uint8_t)pnVar18->Data;
          break;
        case 0xc:
          sVar11 = (short)(int)pnVar18->Data;
LAB_00103731:
          Class->Priority = sVar11 + -1000;
          break;
        case 0x10:
          iVar12 = (*(code *)pnVar18->Data)(*(undefined4 *)&Class[1].Meta);
          if (iVar12 != 0) {
            ReleaseMetaLookup(pnVar19,Class);
            pnVar19->NodeCache = (void *)0x0;
            Class->State = -2;
          }
          break;
        case 0x12:
          lVar15 = (*(code *)pnVar18->Data)(pnVar19,pnVar4,0xb,local_38);
          if (lVar15 != 0) {
            Class->Flags = (uint8_t)local_38[0];
          }
          lVar15 = (*(code *)pnVar18->Data)(pnVar19,pnVar4,0xc,local_38);
          if (lVar15 != 0) {
            sVar11 = (short)local_38[0];
            goto LAB_00103731;
          }
        }
      }
      uVar3 = *(uint *)(pnVar18 + 1);
      pnVar18 = pnVar18 + 1;
    } while ((char)uVar3 != '\0');
  }
  if ((('\0' < Class->State) && ((Class->Flags & 0x21) == 1)) &&
     (pnVar16 = NodeCreateFromClass(pnVar19,Class,1), pnVar16 == (node *)0x0)) {
    pnVar19->NodeCache = (void *)0x0;
    Class->State = -2;
    UnInitClass(pnVar19,Class,0);
  }
  if (('\0' < Class->State) && (7 < (pnVar19->NodeClass)._Used)) {
    pcVar20 = (pnVar19->NodeClass)._Begin;
    do {
      if ((*(nodeclass **)pcVar20)->ParentClass == Class) {
        InitClass(pnVar19,*(nodeclass **)pcVar20);
      }
      pcVar20 = pcVar20 + 8;
    } while (pcVar20 !=
             (pnVar19->NodeClass)._Begin + ((pnVar19->NodeClass)._Used & 0xfffffffffffffff8));
  }
  return;
}

Assistant:

static void InitClass(nodecontext* p,nodeclass* Class)
{
    const nodeclass* Parent = Class->ParentClass;
    if (Class->State==CLASS_REGISTERED && Class->Meta && (!Class->ParentId || (Parent && Parent->State>=CLASS_INITED)))
    {
        uintptr_t Data;
        const nodemeta* i;

        if (Parent)
        {
            fourcc_t ClassId;

            if (Class->VMTSize == DEFAULT_VMT && Parent->VMTSize > DEFAULT_VMT)
            {
                Class = NodeClassResize(p,Class,Parent->VMTSize);
                if (!Class)
                    return;
            }

            assert(Parent->VMTSize >= DEFAULT_VMT);
            assert(Class->VMTSize >= Parent->VMTSize);
            assert(NodeClass_Context(Parent) == NodeClass_Context(Class));

            ClassId = NodeClass_ClassId(Class);
            memcpy(Class+1,Parent+1,MIN(Class->VMTSize,Parent->VMTSize));
            NodeClass_ClassId(Class) = ClassId;
        }

        BuildMetaLookup(p,Class);

        assert(Class->VMTSize >= DEFAULT_VMT);
        Class->State = CLASS_INITED;

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_VMT)
            {
#if defined(CONFIG_CORECDOC)
                if ((i->Meta & ~META_MODE_MASK)==TYPE_FUNC) // otherwise it might be some doc items
#endif
                    MetaConst(i,Class+1);
            }
            else
            switch (i->Meta)
            {
            case META_CLASS_VMT_CREATE:
                if (((int(*)(fourcc_t,void*))i->Data)(NodeClass_ClassId(Class),Class+1) != ERR_NONE)
                {
                    ReleaseMetaLookup(p,Class);
                    p->NodeCache = NULL;
                    Class->State = CLASS_FAILED;
                }
                break;

            case META_CLASS_META:
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_FLAGS,&Data))
                    Class->Flags = (uint8_t)Data;
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_PRIORITY,&Data))
                    Class->Priority = (int16_t)(Data-PRI_DEFAULT);
                break;

            case META_CLASS_FLAGS:
                Class->Flags = (uint8_t)i->Data;
                break;

            case META_CLASS_PRIORITY:
                Class->Priority = (int16_t)(i->Data-PRI_DEFAULT);
                break;
            }
        }

        if (Class->State>=CLASS_INITED && (Class->Flags & (CFLAG_SINGLETON|CFLAG_OWN_MEMORY))==CFLAG_SINGLETON && !NodeCreateFromClass(p,Class,1))
        {
            p->NodeCache = NULL;
            Class->State = CLASS_FAILED;
            UnInitClass(p,Class,0); // just to call META_CLASS_VMT_DELETE
        }

        if (Class->State>=CLASS_INITED)
        {
            nodeclass** nc;
            for (nc=ARRAYBEGIN(p->NodeClass,nodeclass*);nc!=ARRAYEND(p->NodeClass,nodeclass*);++nc)
                if ((*nc)->ParentClass == Class)
                    InitClass(p,*nc);
        }
    }
}